

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O0

CURLcode easysrc_perform(void)

{
  CURLcode CVar1;
  CURLcode ret_7;
  CURLcode ret_6;
  CURLcode ret_5;
  CURLcode ret_4;
  CURLcode ret_3;
  CURLcode ret_2;
  CURLcode ret_1;
  CURLcode ret;
  char *c;
  curl_slist *ptr;
  int i;
  
  if (easysrc_toohard != (slist_wc *)0x0) {
    CVar1 = easysrc_add(&easysrc_code,"");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    for (ptr._0_4_ = 0; srchard[(int)ptr] != (char *)0x0; ptr._0_4_ = (int)ptr + 1) {
      CVar1 = easysrc_add(&easysrc_code,srchard[(int)ptr]);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    if (easysrc_toohard != (slist_wc *)0x0) {
      for (c = (char *)easysrc_toohard->first; c != (char *)0x0; c = *(char **)(c + 8)) {
        CVar1 = easysrc_add(&easysrc_code,*(char **)c);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
      }
    }
    CVar1 = easysrc_add(&easysrc_code,"");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    CVar1 = easysrc_add(&easysrc_code,"*/");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = (slist_wc *)0x0;
  }
  ptr._4_4_ = easysrc_add(&easysrc_code,"");
  if (((ptr._4_4_ == CURLE_OK) &&
      (ptr._4_4_ = easysrc_add(&easysrc_code,"ret = curl_easy_perform(hnd);"), ptr._4_4_ == CURLE_OK
      )) && (ptr._4_4_ = easysrc_add(&easysrc_code,""), ptr._4_4_ == CURLE_OK)) {
    ptr._4_4_ = CURLE_OK;
  }
  return ptr._4_4_;
}

Assistant:

CURLcode easysrc_perform(void)
{
  /* Note any setopt calls which we could not convert */
  if(easysrc_toohard) {
    int i;
    struct curl_slist *ptr;
    const char *c;
    CHKRET(easysrc_add(&easysrc_code, ""));
    /* Preamble comment */
    for(i = 0; ((c = srchard[i]) != NULL); i++)
      CHKRET(easysrc_add(&easysrc_code, c));
    /* Each unconverted option */
    if(easysrc_toohard) {
      for(ptr = easysrc_toohard->first; ptr; ptr = ptr->next)
        CHKRET(easysrc_add(&easysrc_code, ptr->data));
    }
    CHKRET(easysrc_add(&easysrc_code, ""));
    CHKRET(easysrc_add(&easysrc_code, "*/"));

    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = NULL;
  }

  CHKRET(easysrc_add(&easysrc_code, ""));
  CHKRET(easysrc_add(&easysrc_code, "ret = curl_easy_perform(hnd);"));
  CHKRET(easysrc_add(&easysrc_code, ""));

  return CURLE_OK;
}